

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcdctmgr.c
# Opt level: O3

void forward_DCT_float(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY sample_data,
                      JBLOCKROW coef_blocks,JDIMENSION start_row,JDIMENSION start_col,
                      JDIMENSION num_blocks)

{
  jpeg_component_info *pjVar1;
  float *pfVar2;
  forward_DCT_ptr p_Var3;
  forward_DCT_ptr p_Var4;
  long lVar5;
  JBLOCKROW paJVar6;
  JDIMENSION JVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  float workspace [64];
  undefined1 local_138 [4];
  float afStack_134 [65];
  
  if (num_blocks != 0) {
    p_Var3 = cinfo->fdct[2].forward_DCT[(long)compptr->component_index + 2];
    p_Var4 = cinfo->fdct[3].forward_DCT[(long)compptr->quant_tbl_no + 1];
    paJVar6 = (JBLOCKROW)(ulong)start_row;
    pjVar1 = (jpeg_component_info *)(sample_data + (long)paJVar6);
    uVar8 = 0;
    JVar7 = start_col;
    do {
      (*p_Var3)((j_compress_ptr)local_138,pjVar1,(JSAMPARRAY)(ulong)JVar7,paJVar6,start_row,
                start_col,(JDIMENSION)compptr);
      lVar5 = 0;
      do {
        pfVar2 = (float *)(p_Var4 + lVar5 * 4);
        auVar9._0_4_ = (int)(*pfVar2 * *(float *)(local_138 + lVar5 * 4) + 16384.5);
        auVar9._4_4_ = (int)(pfVar2[1] * afStack_134[lVar5] + 16384.5);
        auVar9._8_4_ = (int)(pfVar2[2] * afStack_134[lVar5 + 1] + 16384.5);
        auVar9._12_4_ = (int)(pfVar2[3] * afStack_134[lVar5 + 2] + 16384.5);
        auVar9 = pshuflw(auVar9,auVar9,0xe8);
        auVar9 = pshufhw(auVar9,auVar9,0xe8);
        *(ulong *)(*coef_blocks + lVar5) =
             CONCAT26(auVar9._10_2_ + -0x4000,
                      CONCAT24(auVar9._8_2_ + -0x4000,
                               CONCAT22(auVar9._2_2_ + -0x4000,auVar9._0_2_ + -0x4000)));
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0x40);
      uVar8 = uVar8 + 1;
      JVar7 = JVar7 + compptr->DCT_h_scaled_size;
      coef_blocks = coef_blocks + 1;
    } while (uVar8 != num_blocks);
  }
  return;
}

Assistant:

METHODDEF(void)
forward_DCT_float (j_compress_ptr cinfo, jpeg_component_info * compptr,
		   JSAMPARRAY sample_data, JBLOCKROW coef_blocks,
		   JDIMENSION start_row, JDIMENSION start_col,
		   JDIMENSION num_blocks)
/* This version is used for floating-point DCT implementations. */
{
  /* This routine is heavily used, so it's worth coding it tightly. */
  my_fdct_ptr fdct = (my_fdct_ptr) cinfo->fdct;
  float_DCT_method_ptr do_dct = fdct->do_float_dct[compptr->component_index];
  FAST_FLOAT * divisors = fdct->float_divisors[compptr->quant_tbl_no];
  FAST_FLOAT workspace[DCTSIZE2]; /* work area for FDCT subroutine */
  JDIMENSION bi;

  sample_data += start_row;	/* fold in the vertical offset once */

  for (bi = 0; bi < num_blocks; bi++, start_col += compptr->DCT_h_scaled_size) {
    /* Perform the DCT */
    (*do_dct) (workspace, sample_data, start_col);

    /* Quantize/descale the coefficients, and store into coef_blocks[] */
    { register FAST_FLOAT temp;
      register int i;
      register JCOEFPTR output_ptr = coef_blocks[bi];

      for (i = 0; i < DCTSIZE2; i++) {
	/* Apply the quantization and scaling factor */
	temp = workspace[i] * divisors[i];
	/* Round to nearest integer.
	 * Since C does not specify the direction of rounding for negative
	 * quotients, we have to force the dividend positive for portability.
	 * The maximum coefficient size is +-16K (for 12-bit data), so this
	 * code should work for either 16-bit or 32-bit ints.
	 */
	output_ptr[i] = (JCOEF) ((int) (temp + (FAST_FLOAT) 16384.5) - 16384);
      }
    }
  }
}